

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O2

void MULTILABEL::print_update(vw *all,bool is_test,example *ec)

{
  bool holdout_set_off;
  shared_data *psVar1;
  size_t current_pass;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  stringstream label_string;
  stringstream pred_string;
  string local_380;
  string local_360;
  stringstream local_340 [16];
  ostream local_330;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  psVar1 = all->sd;
  if ((((double)psVar1->dump_interval <=
        psVar1->weighted_labeled_examples + psVar1->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    std::__cxx11::stringstream::stringstream(local_340);
    if (is_test) {
      std::operator<<(&local_330," unknown");
    }
    else {
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 2);
          uVar3 = uVar3 + 1) {
        poVar2 = std::operator<<(&local_330," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      }
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    for (uVar3 = 0;
        uVar3 < (ulong)((long)(ec->pred).scalars._end - (long)(ec->pred).scalars._begin >> 2);
        uVar3 = uVar3 + 1) {
      poVar2 = std::operator<<(&local_1a8," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    psVar1 = all->sd;
    current_pass = all->current_pass;
    holdout_set_off = all->holdout_set_off;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    shared_data::print_update
              (psVar1,holdout_set_off,current_pass,&local_360,&local_380,ec->num_features,
               all->progress_add,all->progress_arg);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::__cxx11::stringstream::~stringstream(local_340);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    stringstream label_string;
    if (is_test)
      label_string << " unknown";
    else
      for (size_t i = 0; i < ec.l.multilabels.label_v.size(); i++) label_string << " " << ec.l.multilabels.label_v[i];

    stringstream pred_string;
    for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      pred_string << " " << ec.pred.multilabels.label_v[i];

    all.sd->print_update(all.holdout_set_off, all.current_pass, label_string.str(), pred_string.str(), ec.num_features,
        all.progress_add, all.progress_arg);
  }
}